

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

bool __thiscall wasm::DataFlow::Node::returnsI1(Node *this)

{
  bool bVar1;
  Binary *this_00;
  Unary *this_01;
  Unary *unary;
  Binary *binary;
  Node *this_local;
  
  bVar1 = isExpr(this);
  if (bVar1) {
    this_00 = Expression::dynCast<wasm::Binary>((this->field_1).expr);
    if (this_00 != (Binary *)0x0) {
      bVar1 = Binary::isRelational(this_00);
      return bVar1;
    }
    this_01 = Expression::dynCast<wasm::Unary>((this->field_1).expr);
    if (this_01 != (Unary *)0x0) {
      bVar1 = Unary::isRelational(this_01);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool returnsI1() {
    if (isExpr()) {
      if (auto* binary = expr->dynCast<Binary>()) {
        return binary->isRelational();
      } else if (auto* unary = expr->dynCast<Unary>()) {
        return unary->isRelational();
      }
    }
    return false;
  }